

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_process_tag(yaml_emitter_t *emitter)

{
  int iVar1;
  yaml_emitter_t *emitter_local;
  
  if (((emitter->tag_data).handle == (yaml_char_t *)0x0) &&
     ((emitter->tag_data).suffix == (yaml_char_t *)0x0)) {
    return 1;
  }
  if ((emitter->tag_data).handle == (yaml_char_t *)0x0) {
    iVar1 = yaml_emitter_write_indicator(emitter,"!<",1,0,0);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = yaml_emitter_write_tag_content
                      (emitter,(emitter->tag_data).suffix,(emitter->tag_data).suffix_length,0);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = yaml_emitter_write_indicator(emitter,">",0,0,0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = yaml_emitter_write_tag_handle
                      (emitter,(emitter->tag_data).handle,(emitter->tag_data).handle_length);
    if (iVar1 == 0) {
      return 0;
    }
    if (((emitter->tag_data).suffix != (yaml_char_t *)0x0) &&
       (iVar1 = yaml_emitter_write_tag_content
                          (emitter,(emitter->tag_data).suffix,(emitter->tag_data).suffix_length,0),
       iVar1 == 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
yaml_emitter_process_tag(yaml_emitter_t *emitter)
{
    if (!emitter->tag_data.handle && !emitter->tag_data.suffix)
        return 1;

    if (emitter->tag_data.handle)
    {
        if (!yaml_emitter_write_tag_handle(emitter, emitter->tag_data.handle,
                    emitter->tag_data.handle_length))
            return 0;
        if (emitter->tag_data.suffix) {
            if (!yaml_emitter_write_tag_content(emitter, emitter->tag_data.suffix,
                        emitter->tag_data.suffix_length, 0))
                return 0;
        }
    }
    else
    {
        if (!yaml_emitter_write_indicator(emitter, "!<", 1, 0, 0))
            return 0;
        if (!yaml_emitter_write_tag_content(emitter, emitter->tag_data.suffix,
                    emitter->tag_data.suffix_length, 0))
            return 0;
        if (!yaml_emitter_write_indicator(emitter, ">", 0, 0, 0))
            return 0;
    }

    return 1;
}